

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

uint32_t get_nfc(uint32_t uc,uint32_t uc2)

{
  bool bVar1;
  uint32_t in_EAX;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0x3a2;
  iVar3 = 0;
  do {
    if (iVar4 < iVar3) {
      return 0;
    }
    iVar2 = (iVar4 + iVar3) / 2;
    if (u_composition_table[iVar2].cp1 < uc) {
LAB_004b2354:
      iVar3 = iVar2 + 1;
      bVar1 = true;
    }
    else if (uc < u_composition_table[iVar2].cp1) {
LAB_004b2361:
      iVar4 = iVar2 + -1;
      bVar1 = true;
    }
    else {
      if (u_composition_table[iVar2].cp2 < uc2) goto LAB_004b2354;
      if (uc2 < u_composition_table[iVar2].cp2) goto LAB_004b2361;
      in_EAX = u_composition_table[iVar2].nfc;
      bVar1 = false;
    }
    if (!bVar1) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

static uint32_t
get_nfc(uint32_t uc, uint32_t uc2)
{
	int t, b;

	t = 0;
	b = sizeof(u_composition_table)/sizeof(u_composition_table[0]) -1;
	while (b >= t) {
		int m = (t + b) / 2;
		if (u_composition_table[m].cp1 < uc)
			t = m + 1;
		else if (u_composition_table[m].cp1 > uc)
			b = m - 1;
		else if (u_composition_table[m].cp2 < uc2)
			t = m + 1;
		else if (u_composition_table[m].cp2 > uc2)
			b = m - 1;
		else
			return (u_composition_table[m].nfc);
	}
	return (0);
}